

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter_test.cpp
# Opt level: O0

void __thiscall
InterpreterTestSuite_PC_Token_Test::TestBody(InterpreterTestSuite_PC_Token_Test *this)

{
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar1;
  pointer *ppuVar2;
  initializer_list<unsigned_char> __l;
  bool bVar3;
  element_type *peVar4;
  MockSpec<ot::commissioner::Error_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_unsigned_short)>
  *this_00;
  TypedExpectation<ot::commissioner::Error_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_unsigned_short)>
  *this_01;
  MockSpec<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&()> *pMVar5;
  TypedExpectation<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&()> *pTVar6;
  char *pcVar7;
  MockSpec<ot::commissioner::Error_(const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&)>
  *this_02;
  TypedExpectation<ot::commissioner::Error_(const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&)>
  *this_03;
  CommissionerAppMock *pCVar8;
  char *in_R9;
  string local_710;
  AssertHelper local_6f0;
  Message local_6e8;
  bool local_6d9;
  undefined1 local_6d8 [8];
  AssertionResult gtest_ar__2;
  allocator local_679;
  string local_678;
  Expression local_658;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *local_640;
  Action<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&()> local_638;
  WithoutMatchers local_611;
  MockSpec<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&()> local_610;
  Error local_600;
  ReturnAction<ot::commissioner::Error> local_5d8;
  undefined1 local_5c8 [40];
  Matcher<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&> local_5a0;
  MockSpec<ot::commissioner::Error_(const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&)>
  local_588;
  AssertHelper local_568;
  Message local_560;
  ErrorCode local_558;
  allocator local_551;
  string local_550;
  allocator local_529;
  string local_528;
  Error local_508;
  ErrorCode local_4dc;
  undefined1 local_4d8 [8];
  AssertionResult gtest_ar;
  AssertHelper local_4a8;
  Message local_4a0;
  bool local_491;
  undefined1 local_490 [8];
  AssertionResult gtest_ar__1;
  allocator local_431;
  string local_430;
  Expression local_410;
  undefined1 local_3f8 [47];
  WithoutMatchers local_3c9;
  MockSpec<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&()> local_3c8;
  string local_3b8;
  AssertHelper local_398;
  undefined1 local_390 [16];
  undefined1 local_380 [8];
  AssertionResult gtest_ar_;
  allocator local_321;
  string local_320;
  Expression local_300;
  undefined1 local_2e8 [47];
  WithoutMatchers local_2b9;
  MockSpec<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&()> local_2b8;
  Error local_2a8;
  ReturnAction<ot::commissioner::Error> local_280;
  undefined1 local_270 [40];
  Matcher<unsigned_short> local_248;
  Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  local_230;
  MockSpec<ot::commissioner::Error_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_unsigned_short)>
  local_218;
  allocator<unsigned_char> local_1df;
  undefined1 local_1de [14];
  _Base_ptr local_1d0;
  undefined1 local_1c8 [8];
  ByteArray token;
  Value value;
  Expression expr;
  undefined1 local_140 [8];
  TestContext ctx;
  InterpreterTestSuite_PC_Token_Test *this_local;
  
  ctx.mCommissionerAppStaticExpecter.gmock02_Create_150.super_UntypedFunctionMockerBase.
  untyped_expectations_.
  super__Vector_base<std::shared_ptr<testing::internal::ExpectationBase>,_std::allocator<std::shared_ptr<testing::internal::ExpectationBase>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)this;
  InterpreterTestSuite::TestContext::TestContext((TestContext *)local_140);
  InterpreterTestSuite::InitContext(&this->super_InterpreterTestSuite,(TestContext *)local_140);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)((long)&value.mData.field_2 + 8));
  ot::commissioner::Interpreter::Value::Value
            ((Value *)&token.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage);
  local_1de[0] = '1';
  local_1de[1] = 0x32;
  local_1de[2] = 0x33;
  local_1de[3] = 0x61;
  local_1de[4] = 0x65;
  local_1de[5] = 0x66;
  local_1de._6_8_ = local_1de;
  local_1d0 = (_Base_ptr)0x6;
  std::allocator<unsigned_char>::allocator(&local_1df);
  __l._M_len = (size_type)local_1d0;
  __l._M_array = (iterator)local_1de._6_8_;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_1c8,__l,&local_1df);
  std::allocator<unsigned_char>::~allocator(&local_1df);
  peVar4 = std::__shared_ptr_access<CommissionerAppMock,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator*((__shared_ptr_access<CommissionerAppMock,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      *)&ctx.mRegistry);
  testing::internal::AnythingMatcher::operator_cast_to_Matcher
            (&local_230,(AnythingMatcher *)&testing::_);
  testing::internal::AnythingMatcher::operator_cast_to_Matcher
            (&local_248,(AnythingMatcher *)&testing::_);
  CommissionerAppMock::gmock_RequestToken(&local_218,peVar4,&local_230,&local_248);
  testing::internal::GetWithoutMatchers();
  this_00 = testing::internal::
            MockSpec<ot::commissioner::Error_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_unsigned_short)>
            ::operator()(&local_218,(WithoutMatchers *)(local_270 + 0x27),(void *)0x0);
  this_01 = testing::internal::
            MockSpec<ot::commissioner::Error_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_unsigned_short)>
            ::InternalExpectedAt
                      (this_00,
                       "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/interpreter_test.cpp"
                       ,0x4b1,"*ctx.mDefaultCommissionerObject","RequestToken(_, _)");
  ot::commissioner::Error::Error(&local_2a8);
  testing::Return<ot::commissioner::Error>((testing *)&local_280,&local_2a8);
  testing::internal::ReturnAction::operator_cast_to_Action
            ((Action<ot::commissioner::Error_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_unsigned_short)>
              *)local_270,(ReturnAction *)&local_280);
  pCVar8 = (CommissionerAppMock *)local_270;
  testing::internal::
  TypedExpectation<ot::commissioner::Error_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_unsigned_short)>
  ::WillOnce(this_01,(Action<ot::commissioner::Error_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_unsigned_short)>
                      *)pCVar8);
  testing::
  Action<ot::commissioner::Error_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_unsigned_short)>
  ::~Action((Action<ot::commissioner::Error_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_unsigned_short)>
             *)local_270);
  testing::internal::ReturnAction<ot::commissioner::Error>::~ReturnAction(&local_280);
  ot::commissioner::Error::~Error(&local_2a8);
  testing::internal::
  MockSpec<ot::commissioner::Error_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_unsigned_short)>
  ::~MockSpec(&local_218);
  testing::Matcher<unsigned_short>::~Matcher(&local_248);
  testing::
  Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>::
  ~Matcher(&local_230);
  peVar4 = std::__shared_ptr_access<CommissionerAppMock,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator*((__shared_ptr_access<CommissionerAppMock,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      *)&ctx.mRegistry);
  local_2b8.function_mocker_ =
       (FunctionMocker<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&()> *)
       CommissionerAppMock::gmock_GetToken
                 ((MockSpec<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&()> *)
                  peVar4,pCVar8);
  testing::internal::GetWithoutMatchers();
  pMVar5 = testing::internal::
           MockSpec<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&()>::
           operator()(&local_2b8,&local_2b9,(void *)0x0);
  pTVar6 = testing::internal::
           MockSpec<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&()>::
           InternalExpectedAt(pMVar5,
                              "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/interpreter_test.cpp"
                              ,0x4b2,"*ctx.mDefaultCommissionerObject","GetToken()");
  local_2e8._0_8_ =
       testing::ReturnRef<std::vector<unsigned_char,std::allocator<unsigned_char>>const>
                 ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_1c8);
  testing::internal::ReturnRefAction::operator_cast_to_Action
            ((Action<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&()> *)
             (local_2e8 + 8),(ReturnRefAction *)local_2e8);
  testing::internal::
  TypedExpectation<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&()>::WillOnce
            (pTVar6,(Action<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&()> *)
                    (local_2e8 + 8));
  testing::Action<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&()>::~Action
            ((Action<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&()> *)
             (local_2e8 + 8));
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_320,"token request 127.0.0.1 2001",&local_321);
  ot::commissioner::Interpreter::ParseExpression(&local_300,(Interpreter *)local_140,&local_320);
  pvVar1 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)((long)&value.mData.field_2 + 8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=(pvVar1,&local_300);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_300);
  std::__cxx11::string::~string((string *)&local_320);
  std::allocator<char>::~allocator((allocator<char> *)&local_321);
  ot::commissioner::Interpreter::Eval((Value *)&gtest_ar_.message_,(Interpreter *)local_140,pvVar1);
  ppuVar2 = &token.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
  ot::commissioner::Interpreter::Value::operator=((Value *)ppuVar2,(Value *)&gtest_ar_.message_);
  ot::commissioner::Interpreter::Value::~Value((Value *)&gtest_ar_.message_);
  local_390[0xf] = ot::commissioner::Interpreter::Value::HasNoError((Value *)ppuVar2);
  pCVar8 = (CommissionerAppMock *)(local_390 + 0xf);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_380,(bool *)pCVar8,(type *)0x0);
  bVar3 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_380);
  if (!bVar3) {
    testing::Message::Message((Message *)local_390);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_3b8,(internal *)local_380,(AssertionResult *)0x46a487,"false","true",in_R9);
    pcVar7 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_398,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/interpreter_test.cpp"
               ,0x4b6,pcVar7);
    pCVar8 = (CommissionerAppMock *)local_390;
    testing::internal::AssertHelper::operator=(&local_398,(Message *)pCVar8);
    testing::internal::AssertHelper::~AssertHelper(&local_398);
    std::__cxx11::string::~string((string *)&local_3b8);
    testing::Message::~Message((Message *)local_390);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_380);
  peVar4 = std::__shared_ptr_access<CommissionerAppMock,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator*((__shared_ptr_access<CommissionerAppMock,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      *)&ctx.mRegistry);
  local_3c8.function_mocker_ =
       (FunctionMocker<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&()> *)
       CommissionerAppMock::gmock_GetToken
                 ((MockSpec<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&()> *)
                  peVar4,pCVar8);
  testing::internal::GetWithoutMatchers();
  pMVar5 = testing::internal::
           MockSpec<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&()>::
           operator()(&local_3c8,&local_3c9,(void *)0x0);
  pTVar6 = testing::internal::
           MockSpec<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&()>::
           InternalExpectedAt(pMVar5,
                              "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/interpreter_test.cpp"
                              ,0x4b8,"*ctx.mDefaultCommissionerObject","GetToken()");
  local_3f8._0_8_ =
       testing::ReturnRef<std::vector<unsigned_char,std::allocator<unsigned_char>>const>
                 ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_1c8);
  testing::internal::ReturnRefAction::operator_cast_to_Action
            ((Action<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&()> *)
             (local_3f8 + 8),(ReturnRefAction *)local_3f8);
  testing::internal::
  TypedExpectation<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&()>::WillOnce
            (pTVar6,(Action<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&()> *)
                    (local_3f8 + 8));
  testing::Action<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&()>::~Action
            ((Action<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&()> *)
             (local_3f8 + 8));
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_430,"token print",&local_431);
  ot::commissioner::Interpreter::ParseExpression(&local_410,(Interpreter *)local_140,&local_430);
  pvVar1 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)((long)&value.mData.field_2 + 8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=(pvVar1,&local_410);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_410);
  std::__cxx11::string::~string((string *)&local_430);
  std::allocator<char>::~allocator((allocator<char> *)&local_431);
  ot::commissioner::Interpreter::Eval
            ((Value *)&gtest_ar__1.message_,(Interpreter *)local_140,pvVar1);
  ppuVar2 = &token.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
  ot::commissioner::Interpreter::Value::operator=((Value *)ppuVar2,(Value *)&gtest_ar__1.message_);
  ot::commissioner::Interpreter::Value::~Value((Value *)&gtest_ar__1.message_);
  local_491 = ot::commissioner::Interpreter::Value::HasNoError((Value *)ppuVar2);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_490,&local_491,(type *)0x0);
  bVar3 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_490);
  if (!bVar3) {
    testing::Message::Message(&local_4a0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar.message_,(internal *)local_490,(AssertionResult *)0x46a487,
               "false","true",in_R9);
    pcVar7 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_4a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/interpreter_test.cpp"
               ,0x4bb,pcVar7);
    testing::internal::AssertHelper::operator=(&local_4a8,&local_4a0);
    testing::internal::AssertHelper::~AssertHelper(&local_4a8);
    std::__cxx11::string::~string((string *)&gtest_ar.message_);
    testing::Message::~Message(&local_4a0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_490);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_528,"123aef",&local_529);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_550,"./tmp/token",&local_551);
  ot::commissioner::WriteFile(&local_508,&local_528,&local_550);
  local_4dc = ot::commissioner::Error::GetCode(&local_508);
  local_558 = kNone;
  testing::internal::EqHelper::
  Compare<ot::commissioner::ErrorCode,_ot::commissioner::ErrorCode,_nullptr>
            ((EqHelper *)local_4d8,"WriteFile(\"123aef\", \"./tmp/token\").GetCode()",
             "ErrorCode::kNone",&local_4dc,&local_558);
  ot::commissioner::Error::~Error(&local_508);
  std::__cxx11::string::~string((string *)&local_550);
  std::allocator<char>::~allocator((allocator<char> *)&local_551);
  std::__cxx11::string::~string((string *)&local_528);
  std::allocator<char>::~allocator((allocator<char> *)&local_529);
  bVar3 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_4d8);
  if (!bVar3) {
    testing::Message::Message(&local_560);
    pcVar7 = testing::AssertionResult::failure_message((AssertionResult *)local_4d8);
    testing::internal::AssertHelper::AssertHelper
              (&local_568,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/interpreter_test.cpp"
               ,0x4bd,pcVar7);
    testing::internal::AssertHelper::operator=(&local_568,&local_560);
    testing::internal::AssertHelper::~AssertHelper(&local_568);
    testing::Message::~Message(&local_560);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_4d8);
  peVar4 = std::__shared_ptr_access<CommissionerAppMock,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator*((__shared_ptr_access<CommissionerAppMock,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      *)&ctx.mRegistry);
  testing::internal::AnythingMatcher::operator_cast_to_Matcher
            (&local_5a0,(AnythingMatcher *)&testing::_);
  CommissionerAppMock::gmock_SetToken(&local_588,peVar4,&local_5a0);
  testing::internal::GetWithoutMatchers();
  this_02 = testing::internal::
            MockSpec<ot::commissioner::Error_(const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&)>
            ::operator()(&local_588,(WithoutMatchers *)(local_5c8 + 0x27),(void *)0x0);
  this_03 = testing::internal::
            MockSpec<ot::commissioner::Error_(const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&)>
            ::InternalExpectedAt
                      (this_02,
                       "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/interpreter_test.cpp"
                       ,0x4be,"*ctx.mDefaultCommissionerObject","SetToken(_)");
  ot::commissioner::Error::Error(&local_600);
  testing::Return<ot::commissioner::Error>((testing *)&local_5d8,&local_600);
  testing::internal::ReturnAction::operator_cast_to_Action
            ((Action<ot::commissioner::Error_(const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&)>
              *)local_5c8,(ReturnAction *)&local_5d8);
  pCVar8 = (CommissionerAppMock *)local_5c8;
  testing::internal::
  TypedExpectation<ot::commissioner::Error_(const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&)>
  ::WillOnce(this_03,(Action<ot::commissioner::Error_(const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&)>
                      *)pCVar8);
  testing::
  Action<ot::commissioner::Error_(const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&)>
  ::~Action((Action<ot::commissioner::Error_(const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&)>
             *)local_5c8);
  testing::internal::ReturnAction<ot::commissioner::Error>::~ReturnAction(&local_5d8);
  ot::commissioner::Error::~Error(&local_600);
  testing::internal::
  MockSpec<ot::commissioner::Error_(const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&)>
  ::~MockSpec(&local_588);
  testing::Matcher<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&>::~Matcher
            (&local_5a0);
  peVar4 = std::__shared_ptr_access<CommissionerAppMock,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator*((__shared_ptr_access<CommissionerAppMock,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      *)&ctx.mRegistry);
  local_610.function_mocker_ =
       (FunctionMocker<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&()> *)
       CommissionerAppMock::gmock_GetToken
                 ((MockSpec<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&()> *)
                  peVar4,pCVar8);
  testing::internal::GetWithoutMatchers();
  pMVar5 = testing::internal::
           MockSpec<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&()>::
           operator()(&local_610,&local_611,(void *)0x0);
  pTVar6 = testing::internal::
           MockSpec<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&()>::
           InternalExpectedAt(pMVar5,
                              "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/interpreter_test.cpp"
                              ,0x4bf,"*ctx.mDefaultCommissionerObject","GetToken()");
  local_640 = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
              testing::ReturnRef<std::vector<unsigned_char,std::allocator<unsigned_char>>const>
                        ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_1c8);
  testing::internal::ReturnRefAction::operator_cast_to_Action
            (&local_638,(ReturnRefAction *)&local_640);
  testing::internal::
  TypedExpectation<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&()>::WillOnce
            (pTVar6,&local_638);
  testing::Action<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&()>::~Action
            (&local_638);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_678,"token set ./tmp/token",&local_679);
  ot::commissioner::Interpreter::ParseExpression(&local_658,(Interpreter *)local_140,&local_678);
  pvVar1 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)((long)&value.mData.field_2 + 8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=(pvVar1,&local_658);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_658);
  std::__cxx11::string::~string((string *)&local_678);
  std::allocator<char>::~allocator((allocator<char> *)&local_679);
  ot::commissioner::Interpreter::Eval
            ((Value *)&gtest_ar__2.message_,(Interpreter *)local_140,pvVar1);
  ppuVar2 = &token.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
  ot::commissioner::Interpreter::Value::operator=((Value *)ppuVar2,(Value *)&gtest_ar__2.message_);
  ot::commissioner::Interpreter::Value::~Value((Value *)&gtest_ar__2.message_);
  local_6d9 = ot::commissioner::Interpreter::Value::HasNoError((Value *)ppuVar2);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_6d8,&local_6d9,(type *)0x0);
  bVar3 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_6d8);
  if (!bVar3) {
    testing::Message::Message(&local_6e8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_710,(internal *)local_6d8,(AssertionResult *)0x46a487,"false","true",in_R9);
    pcVar7 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_6f0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/interpreter_test.cpp"
               ,0x4c2,pcVar7);
    testing::internal::AssertHelper::operator=(&local_6f0,&local_6e8);
    testing::internal::AssertHelper::~AssertHelper(&local_6f0);
    std::__cxx11::string::~string((string *)&local_710);
    testing::Message::~Message(&local_6e8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_6d8);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_1c8);
  ot::commissioner::Interpreter::Value::~Value
            ((Value *)&token.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)((long)&value.mData.field_2 + 8));
  InterpreterTestSuite::TestContext::~TestContext((TestContext *)local_140);
  return;
}

Assistant:

TEST_F(InterpreterTestSuite, PC_Token)
{
    TestContext ctx;
    InitContext(ctx);

    Interpreter::Expression expr;
    Interpreter::Value      value;

    const ByteArray token = {'1', '2', '3', 'a', 'e', 'f'};

    EXPECT_CALL(*ctx.mDefaultCommissionerObject, RequestToken(_, _)).WillOnce(Return(Error{}));
    EXPECT_CALL(*ctx.mDefaultCommissionerObject, GetToken()).WillOnce(ReturnRef(token));

    expr  = ctx.mInterpreter.ParseExpression("token request 127.0.0.1 2001");
    value = ctx.mInterpreter.Eval(expr);
    EXPECT_TRUE(value.HasNoError());

    EXPECT_CALL(*ctx.mDefaultCommissionerObject, GetToken()).WillOnce(ReturnRef(token));
    expr  = ctx.mInterpreter.ParseExpression("token print");
    value = ctx.mInterpreter.Eval(expr);
    EXPECT_TRUE(value.HasNoError());

    EXPECT_EQ(WriteFile("123aef", "./tmp/token").GetCode(), ErrorCode::kNone);
    EXPECT_CALL(*ctx.mDefaultCommissionerObject, SetToken(_)).WillOnce(Return(Error{}));
    EXPECT_CALL(*ctx.mDefaultCommissionerObject, GetToken()).WillOnce(ReturnRef(token));
    expr  = ctx.mInterpreter.ParseExpression("token set ./tmp/token");
    value = ctx.mInterpreter.Eval(expr);
    EXPECT_TRUE(value.HasNoError());
}